

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_base_offset_addr(DisasContext_conflict6 *ctx,TCGv_i64 addr,int base,int offset)

{
  TCGContext_conflict6 *tcg_ctx;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  if (base == 0) {
    tcg_gen_movi_i64_mips64el(tcg_ctx,addr,(long)offset);
    return;
  }
  if (offset != 0) {
    tcg_gen_movi_i64_mips64el(tcg_ctx,addr,(long)offset);
    gen_op_addr_add(ctx,addr,tcg_ctx->cpu_gpr[base],addr);
    return;
  }
  gen_load_gpr(tcg_ctx,addr,base);
  return;
}

Assistant:

static void gen_base_offset_addr(DisasContext *ctx, TCGv addr,
                                 int base, int offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (base == 0) {
        tcg_gen_movi_tl(tcg_ctx, addr, offset);
    } else if (offset == 0) {
        gen_load_gpr(tcg_ctx, addr, base);
    } else {
        tcg_gen_movi_tl(tcg_ctx, addr, offset);
        gen_op_addr_add(ctx, addr, tcg_ctx->cpu_gpr[base], addr);
    }
}